

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::FrameBufferBindingTestCase::test
          (FrameBufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  ResultCollector *pRVar1;
  deBool dVar2;
  Enum<int,_2UL> EVar3;
  GetNameFunc local_360;
  int local_358;
  string local_350;
  allocator<char> local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  GLenum local_2a4;
  GetNameFunc p_Stack_2a0;
  deUint32 err_3;
  int local_298;
  GetNameFunc local_290;
  int local_288;
  string local_280;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  GLenum local_1d4;
  GetNameFunc p_Stack_1d0;
  deUint32 err_2;
  int local_1c8;
  GetNameFunc local_1c0;
  int local_1b8;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  GLenum local_104;
  GetNameFunc p_Stack_100;
  deUint32 err_1;
  int local_f8;
  GetNameFunc local_f0;
  int local_e8;
  string local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GLenum local_28;
  GLuint local_24;
  deUint32 err;
  GLuint framebufferId;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  FrameBufferBindingTestCase *this_local;
  
  _err = result;
  result_local = (ResultCollector *)gl;
  gl_local = (CallLogWrapper *)this;
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  local_24 = 0;
  glu::CallLogWrapper::glGenFramebuffers((CallLogWrapper *)result_local,1,&local_24);
  do {
    local_28 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _err;
    if (local_28 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Got Error ",&local_a9)
      ;
      EVar3 = glu::getErrorStr(local_28);
      p_Stack_100 = EVar3.m_getName;
      local_f8 = EVar3.m_value;
      local_f0 = p_Stack_100;
      local_e8 = local_f8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_f0);
      std::operator+(&local_88,&local_a8,&local_e0);
      std::operator+(&local_68,&local_88,": ");
      std::operator+(&local_48,&local_68,"glGenFramebuffers");
      tcu::ResultCollector::fail(pRVar1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)result_local,0x8d40,local_24);
  do {
    local_104 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _err;
    if (local_104 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Got Error ",&local_189);
      EVar3 = glu::getErrorStr(local_104);
      p_Stack_1d0 = EVar3.m_getName;
      local_1c8 = EVar3.m_value;
      local_1c0 = p_Stack_1d0;
      local_1b8 = local_1c8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1b0,&local_1c0);
      std::operator+(&local_168,&local_188,&local_1b0);
      std::operator+(&local_148,&local_168,": ");
      std::operator+(&local_128,&local_148,"glBindFramebuffer");
      tcu::ResultCollector::fail(pRVar1,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_err,(CallLogWrapper *)result_local,0x8ca6,local_24,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)result_local,0x8d40,0);
  do {
    local_1d4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _err;
    if (local_1d4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"Got Error ",&local_259);
      EVar3 = glu::getErrorStr(local_1d4);
      p_Stack_2a0 = EVar3.m_getName;
      local_298 = EVar3.m_value;
      local_290 = p_Stack_2a0;
      local_288 = local_298;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_280,&local_290);
      std::operator+(&local_238,&local_258,&local_280);
      std::operator+(&local_218,&local_238,": ");
      std::operator+(&local_1f8,&local_218,"glBindFramebuffer");
      tcu::ResultCollector::fail(pRVar1,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_err,(CallLogWrapper *)result_local,0x8ca6,0,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)result_local,0x8d40,local_24);
  glu::CallLogWrapper::glDeleteFramebuffers((CallLogWrapper *)result_local,1,&local_24);
  do {
    local_2a4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _err;
    if (local_2a4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"Got Error ",&local_329);
      EVar3 = glu::getErrorStr(local_2a4);
      local_360 = EVar3.m_getName;
      local_358 = EVar3.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_350,&local_360);
      std::operator+(&local_308,&local_328,&local_350);
      std::operator+(&local_2e8,&local_308,": ");
      std::operator+(&local_2c8,&local_2e8,"glDeleteFramebuffers");
      tcu::ResultCollector::fail(pRVar1,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_err,(CallLogWrapper *)result_local,0x8ca6,0,(this->super_BindingTest).m_type);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);

		GLuint framebufferId = 0;
		gl.glGenFramebuffers(1, &framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenFramebuffers");

		gl.glBindFramebuffer(GL_FRAMEBUFFER, framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindFramebuffer");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, framebufferId, m_type);

		gl.glBindFramebuffer(GL_FRAMEBUFFER, 0);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindFramebuffer");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);

		gl.glBindFramebuffer(GL_FRAMEBUFFER, framebufferId);
		gl.glDeleteFramebuffers(1, &framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteFramebuffers");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);
	}